

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmTargetCollectLinkLanguages::Visit(cmTargetCollectLinkLanguages *this,cmLinkItem *item)

{
  pointer pbVar1;
  pointer pcVar2;
  PolicyStatus PVar3;
  cmLinkInterface *pcVar4;
  string *psVar5;
  long lVar6;
  ostream *poVar7;
  cmake *this_00;
  PolicyID id;
  MessageType t;
  string *language;
  pointer __v;
  pointer item_00;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar8;
  undefined1 local_1d0 [16];
  string local_1c0;
  ostringstream e;
  
  if (item->Target == (cmGeneratorTarget *)0x0) {
    psVar5 = cmLinkItem::AsStr_abi_cxx11_(item);
    lVar6 = std::__cxx11::string::find((char *)psVar5,0x417a8a);
    if (lVar6 != -1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      PVar3 = cmLocalGenerator::GetPolicyStatus(this->Target->LocalGenerator,CMP0028);
      if (PVar3 != OLD) {
        if (PVar3 == WARN) {
          cmPolicies::GetPolicyWarning_abi_cxx11_
                    ((string *)(local_1d0 + 0x10),(cmPolicies *)0x1c,id);
          poVar7 = std::operator<<((ostream *)&e,(string *)(local_1d0 + 0x10));
          std::operator<<(poVar7,"\n");
          std::__cxx11::string::~string((string *)(local_1d0 + 0x10));
          t = AUTHOR_WARNING;
        }
        else {
          t = FATAL_ERROR;
        }
        poVar7 = std::operator<<((ostream *)&e,"Target \"");
        poVar7 = std::operator<<(poVar7,(string *)&this->Target->Target->Name);
        poVar7 = std::operator<<(poVar7,"\" links to target \"");
        psVar5 = cmLinkItem::AsStr_abi_cxx11_(item);
        poVar7 = std::operator<<(poVar7,(string *)psVar5);
        std::operator<<(poVar7,
                        "\" but the target was not found.  Perhaps a find_package() call is missing for an IMPORTED target, or an ALIAS target is missing?"
                       );
        this_00 = cmLocalGenerator::GetCMakeInstance(this->Target->LocalGenerator);
        std::__cxx11::stringbuf::str();
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1d0);
        cmake::IssueMessage(this_00,t,(string *)(local_1d0 + 0x10),(cmListFileBacktrace *)local_1d0)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d0 + 8));
        std::__cxx11::string::~string((string *)(local_1d0 + 0x10));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
  }
  else {
    pVar8 = std::
            _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
            ::_M_insert_unique<cmGeneratorTarget_const*const&>
                      ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                        *)&this->Visited,&item->Target);
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar4 = cmGeneratorTarget::GetLinkInterface(item->Target,&this->Config,this->HeadTarget);
      if (pcVar4 != (cmLinkInterface *)0x0) {
        pbVar1 = (pcVar4->Languages).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (__v = (pcVar4->Languages).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; __v != pbVar1; __v = __v + 1) {
          std::__detail::
          _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)this->Languages,__v);
        }
        pcVar2 = (pcVar4->super_cmLinkInterfaceLibraries).Libraries.
                 super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (item_00 = (pcVar4->super_cmLinkInterfaceLibraries).Libraries.
                       super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                       super__Vector_impl_data._M_start; item_00 != pcVar2; item_00 = item_00 + 1) {
          Visit(this,item_00);
        }
      }
    }
  }
  return;
}

Assistant:

void Visit(cmLinkItem const& item)
  {
    if (!item.Target) {
      if (item.AsStr().find("::") != std::string::npos) {
        bool noMessage = false;
        MessageType messageType = MessageType::FATAL_ERROR;
        std::ostringstream e;
        switch (this->Target->GetLocalGenerator()->GetPolicyStatus(
          cmPolicies::CMP0028)) {
          case cmPolicies::WARN: {
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0028) << "\n";
            messageType = MessageType::AUTHOR_WARNING;
          } break;
          case cmPolicies::OLD:
            noMessage = true;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            // Issue the fatal message.
            break;
        }

        if (!noMessage) {
          e << "Target \"" << this->Target->GetName()
            << "\" links to target \"" << item.AsStr()
            << "\" but the target was not found.  Perhaps a find_package() "
               "call is missing for an IMPORTED target, or an ALIAS target is "
               "missing?";
          this->Target->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
            messageType, e.str(), this->Target->GetBacktrace());
        }
      }
      return;
    }
    if (!this->Visited.insert(item.Target).second) {
      return;
    }
    cmLinkInterface const* iface =
      item.Target->GetLinkInterface(this->Config, this->HeadTarget);
    if (!iface) {
      return;
    }

    for (std::string const& language : iface->Languages) {
      this->Languages.insert(language);
    }

    for (cmLinkItem const& lib : iface->Libraries) {
      this->Visit(lib);
    }
  }